

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O1

size_t propagatemark(global_State *g)

{
  uint *puVar1;
  uint8_t uVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  cTValue *pcVar6;
  byte *pbVar7;
  ulong uVar8;
  GCtab *t;
  GCfunc *fn;
  GCobj *pGVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  
  uVar5 = (g->gc).gray.gcptr32;
  fn = (GCfunc *)(ulong)uVar5;
  uVar2 = (fn->c).gct;
  (fn->c).marked = (fn->c).marked | 4;
  (g->gc).gray.gcptr32 = (fn->c).gclist.gcptr32;
  if (uVar2 != '\v') {
    if (uVar2 == '\b') {
      gc_traverse_func(g,fn);
      if ((fn->c).ffid != '\0') {
        return (ulong)(fn->c).nupvalues * 8 + 0x20;
      }
      return (ulong)(fn->c).nupvalues * 4 + 0x14;
    }
    if (uVar2 == '\a') {
      gc_traverse_proto(g,(GCproto *)&fn->c);
      return (ulong)(fn->c).upvalue[0].u32.lo;
    }
    if (uVar2 == '\x06') {
      (fn->c).gclist.gcptr32 = (g->gc).grayagain.gcptr32;
      (g->gc).grayagain.gcptr32 = uVar5;
      (fn->c).marked = (fn->c).marked & 0xfb;
      gc_traverse_thread(g,(lua_State *)&fn->c);
      return (ulong)*(uint *)((long)fn + 0x38) * 8 + 0x40;
    }
    gc_traverse_trace(g,(GCtrace *)&fn->c);
    return (ulong)*(ushort *)((long)&(fn->c).f + 6) * 4 +
           ((ulong)*(ushort *)((long)&(fn->c).f + 4) +
           (ulong)((fn->c).env.gcptr32 - *(int *)&(fn->c).f)) * 8 + 0x60;
  }
  pGVar9 = (GCobj *)(ulong)(fn->c).pc.ptr32;
  if (pGVar9 != (GCobj *)0x0) {
    if (((pGVar9->gch).marked & 3) != 0) {
      gc_mark(g,pGVar9);
    }
    if (((pGVar9->gch).unused1 & 8) == 0) {
      pcVar6 = lj_meta_cache(&pGVar9->tab,MM_mode,(GCstr *)(ulong)g->gcroot[3].gcptr32);
      goto LAB_00113fe4;
    }
  }
  pcVar6 = (cTValue *)0x0;
LAB_00113fe4:
  uVar10 = 0;
  if ((pcVar6 != (cTValue *)0x0) && (uVar10 = 0, (pcVar6->field_2).it == 0xfffffffb)) {
    pbVar7 = (byte *)((ulong)(pcVar6->u32).lo + 0x10);
    uVar10 = 0;
    while( true ) {
      while( true ) {
        bVar3 = *pbVar7;
        pbVar7 = pbVar7 + 1;
        if (bVar3 < 0x6b) break;
        if (bVar3 == 0x76) {
          uVar10 = uVar10 | 0x10;
        }
        else if (bVar3 == 0x6b) {
          uVar10 = uVar10 | 8;
        }
      }
      if (bVar3 == 0) break;
      if (bVar3 == 0x4b) {
        uVar10 = 0xffffffef;
      }
    }
    if (0 < (int)uVar10) {
      (fn->c).marked = (byte)uVar10 | (fn->c).marked & 0xe7;
      (fn->c).gclist.gcptr32 = (g->gc).weak.gcptr32;
      (g->gc).weak.gcptr32 = uVar5;
    }
  }
  uVar5 = 1;
  if (uVar10 != 0x18) {
    if (((uVar10 & 0x10) == 0) && (uVar5 = *(uint *)&(fn->c).f, (ulong)uVar5 != 0)) {
      uVar12 = 0;
      do {
        uVar8 = (ulong)(fn->c).env.gcptr32;
        if ((*(int *)(uVar8 + 4 + uVar12 * 8) + 0xdU < 9) &&
           (pGVar9 = (GCobj *)(ulong)*(uint *)(uVar8 + uVar12 * 8), ((pGVar9->gch).marked & 3) != 0)
           ) {
          gc_mark(g,pGVar9);
        }
        uVar12 = uVar12 + 1;
      } while (uVar5 != uVar12);
    }
    uVar4 = *(uint *)((long)&(fn->c).f + 4);
    uVar5 = uVar10;
    if (uVar4 != 0) {
      uVar8 = (ulong)(fn->l).uvptr[0].gcptr32;
      uVar12 = 0;
      do {
        if (*(int *)(uVar8 + 4 + uVar12 * 0x18) != -1) {
          puVar1 = (uint *)(uVar8 + uVar12 * 0x18);
          if ((((uVar10 & 8) == 0) && (puVar1[3] + 0xd < 9)) &&
             (((((GCobj *)(ulong)puVar1[2])->gch).marked & 3) != 0)) {
            gc_mark(g,(GCobj *)(ulong)puVar1[2]);
          }
          if ((((uVar10 & 0x10) == 0) && (puVar1[1] + 0xd < 9)) &&
             (((((GCobj *)(ulong)*puVar1)->gch).marked & 3) != 0)) {
            gc_mark(g,(GCobj *)(ulong)*puVar1);
          }
        }
        uVar11 = (int)uVar12 + 1;
        uVar12 = (ulong)uVar11;
      } while (uVar11 <= uVar4);
    }
  }
  if (0 < (int)uVar5) {
    (fn->c).marked = (fn->c).marked & 0xfb;
  }
  return (ulong)(*(int *)((long)&(fn->c).f + 4) + 1) * 0x18 + (ulong)*(uint *)&(fn->c).f * 8 + 0x20;
}

Assistant:

static size_t propagatemark(global_State *g)
{
  GCobj *o = gcref(g->gc.gray);
  int gct = o->gch.gct;
  lua_assert(isgray(o));
  gray2black(o);
  setgcrefr(g->gc.gray, o->gch.gclist);  /* Remove from gray list. */
  if (LJ_LIKELY(gct == ~LJ_TTAB)) {
    GCtab *t = gco2tab(o);
    if (gc_traverse_tab(g, t) > 0)
      black2gray(o);  /* Keep weak tables gray. */
    return sizeof(GCtab) + sizeof(TValue) * t->asize +
			   sizeof(Node) * (t->hmask + 1);
  } else if (LJ_LIKELY(gct == ~LJ_TFUNC)) {
    GCfunc *fn = gco2func(o);
    gc_traverse_func(g, fn);
    return isluafunc(fn) ? sizeLfunc((MSize)fn->l.nupvalues) :
			   sizeCfunc((MSize)fn->c.nupvalues);
  } else if (LJ_LIKELY(gct == ~LJ_TPROTO)) {
    GCproto *pt = gco2pt(o);
    gc_traverse_proto(g, pt);
    return pt->sizept;
  } else if (LJ_LIKELY(gct == ~LJ_TTHREAD)) {
    lua_State *th = gco2th(o);
    setgcrefr(th->gclist, g->gc.grayagain);
    setgcref(g->gc.grayagain, o);
    black2gray(o);  /* Threads are never black. */
    gc_traverse_thread(g, th);
    return sizeof(lua_State) + sizeof(TValue) * th->stacksize;
  } else {
#if LJ_HASJIT
    GCtrace *T = gco2trace(o);
    gc_traverse_trace(g, T);
    return ((sizeof(GCtrace)+7)&~7) + (T->nins-T->nk)*sizeof(IRIns) +
	   T->nsnap*sizeof(SnapShot) + T->nsnapmap*sizeof(SnapEntry);
#else
    lua_assert(0);
    return 0;
#endif
  }
}